

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O3

void h261_print_gob(h261_gob *gob)

{
  h261_macroblock *phVar1;
  uint uVar2;
  h261_macroblock *phVar3;
  char cVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  int32_t (*paiVar8) [64];
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  puts("Group of blocks:");
  printf("\tGN = %d\n",(ulong)gob->gn);
  printf("\tGQUANT = %d\n",(ulong)gob->gquant);
  uVar2 = gob->gn;
  iVar7 = 0xb;
  if ((uVar2 & 1) != 0) {
    iVar7 = 0;
  }
  phVar3 = gob->mbs;
  uVar10 = 0;
  do {
    cVar4 = (char)(((uint)uVar10 & 0xff) * 0x75 >> 8);
    bVar6 = (byte)(((byte)((char)uVar10 - cVar4) >> 1) + cVar4) >> 3;
    printf("\tMacroblock %d (%d, %d):\n",uVar10 & 0xffffffff,
           (ulong)((uint)(byte)((char)uVar10 + bVar6 * -0xb) + iVar7),
           (ulong)((uint)bVar6 + (uVar2 - 1 >> 1) * 3));
    printf("\t\tMTYPE =");
    phVar1 = gob->mbs + uVar10;
    uVar5 = gob->mbs[uVar10].mtype;
    if (uVar5 == 0) {
      printf(" [SKIPPED]");
      uVar5 = phVar1->mtype;
    }
    if ((uVar5 & 1) != 0) {
      printf(" CODED");
      uVar5 = phVar1->mtype;
    }
    if ((uVar5 & 2) != 0) {
      printf(" INTRA");
      uVar5 = phVar1->mtype;
    }
    if ((uVar5 & 4) != 0) {
      printf(" QUANT");
      uVar5 = phVar1->mtype;
    }
    if ((uVar5 & 8) != 0) {
      printf(" MC");
      uVar5 = phVar1->mtype;
    }
    if ((uVar5 & 0x10) != 0) {
      printf(" FIL");
    }
    putchar(10);
    uVar5 = phVar1->mtype;
    if ((uVar5 & 3) != 0) {
      printf("\t\tMQUANT = %d\n",(ulong)phVar1->mquant);
      uVar5 = phVar1->mtype;
    }
    if ((uVar5 & 8) != 0) {
      printf("\t\tMVD = %d %d\n",(ulong)phVar1->mvd[0],(ulong)phVar1->mvd[1]);
    }
    printf("\t\tCBP = 0x%02x\n",(ulong)phVar1->cbp);
    uVar11 = 0;
    paiVar8 = phVar3->block;
    do {
      if ((phVar1->cbp >> ((uint)uVar11 & 0x1f) & 1) != 0) {
        printf("\t\tBlock %d:",uVar11 & 0xffffffff);
        lVar9 = 0;
        do {
          printf(" %d",(ulong)(uint)(*paiVar8)[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x40);
        putchar(10);
      }
      uVar11 = uVar11 + 1;
      paiVar8 = paiVar8 + 1;
    } while (uVar11 != 6);
    uVar10 = uVar10 + 1;
    phVar3 = (h261_macroblock *)(phVar3->block + 6);
  } while (uVar10 != 0x21);
  return;
}

Assistant:

void h261_print_gob(struct h261_gob *gob) {
	int i;
	printf("Group of blocks:\n");
	printf("\tGN = %d\n", gob->gn);
	printf("\tGQUANT = %d\n", gob->gquant);
	int gx = (gob->gn & 1 ? 0 : H261_GOB_WIDTH);
	int gy = ((gob->gn - 1) >> 1) * H261_GOB_HEIGHT;
	for (i = 0; i < H261_GOB_MBS; i++) {
		int x = gx + i % H261_GOB_WIDTH;
		int y = gy + i / H261_GOB_WIDTH;
		printf("\tMacroblock %d (%d, %d):\n", i, x, y);
		printf("\t\tMTYPE =");
		struct h261_macroblock *mb = &gob->mbs[i];
		if (!mb->mtype) printf(" [SKIPPED]");
		if (mb->mtype & H261_MTYPE_FLAG_CODED) printf(" CODED");
		if (mb->mtype & H261_MTYPE_FLAG_INTRA) printf(" INTRA");
		if (mb->mtype & H261_MTYPE_FLAG_QUANT) printf(" QUANT");
		if (mb->mtype & H261_MTYPE_FLAG_MC) printf(" MC");
		if (mb->mtype & H261_MTYPE_FLAG_FIL) printf(" FIL");
		printf("\n");
		if (mb->mtype & (H261_MTYPE_FLAG_CODED | H261_MTYPE_FLAG_INTRA))
			printf("\t\tMQUANT = %d\n", mb->mquant);
		if (mb->mtype & H261_MTYPE_FLAG_MC) {
			printf("\t\tMVD = %d %d\n", mb->mvd[0], mb->mvd[1]);
		}
		printf("\t\tCBP = 0x%02x\n", mb->cbp);
		int j;
		for (j = 0; j < 6; j++) {
			if (mb->cbp & (1 << j)) {
				printf("\t\tBlock %d:", j);
				int k;
				for (k = 0; k < 64; k++)
					printf(" %d", mb->block[j][k]);
				printf("\n");
			}
		}
	}
}